

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O0

void Acb_NtkOpt(Acb_Ntk_t *pNtk,Acb_Par_t *pPars)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Acb_ObjType_t AVar5;
  int iVar6;
  int iVar7;
  Acb_Mfs_t *p;
  Vec_Bit_t *p_00;
  abctime aVar8;
  char *pcVar9;
  bool bVar10;
  float fVar11;
  double local_d0;
  double local_c0;
  double local_b0;
  double local_a0;
  double local_90;
  int iObj_1;
  int Value;
  Vec_Bit_t *vVisited;
  int nNodes;
  int RetValue;
  int iObj;
  int n;
  Acb_Mfs_t *pMan;
  Acb_Par_t *pPars_local;
  Acb_Ntk_t *pNtk_local;
  
  p = Acb_MfsStart(pNtk,pPars);
  if (pPars->fVerbose != 0) {
    pcVar9 = "Delay";
    if (p->pPars->fArea != 0) {
      pcVar9 = "Area";
    }
    printf("%s-optimization parameters: TfiLev(I) = %d  TfoLev(O) = %d  WinMax(W) = %d  LutSize = %d\n"
           ,pcVar9,(ulong)(uint)p->pPars->nTfiLevMax,(ulong)(uint)p->pPars->nTfoLevMax,
           (ulong)(uint)p->pPars->nWinNodeMax,(ulong)(uint)p->pPars->nLutSize);
  }
  Acb_NtkCreateFanout(pNtk);
  Acb_NtkCleanObjFuncs(pNtk);
  Acb_NtkCleanObjCnfs(pNtk);
  if (p->pPars->fArea == 0) {
    Acb_NtkUpdateTiming(pNtk,-1);
    while (fVar11 = Vec_QueTopPriority(pNtk->vQue), 0 < (int)fVar11) {
      iVar3 = Vec_QuePop(pNtk->vQue);
      AVar5 = Acb_ObjType(pNtk,iVar3);
      if (AVar5 != ABC_OPER_NONE) {
        Acb_NtkOptNode(p,iVar3);
      }
    }
  }
  else {
    iVar3 = Acb_NtkObjNumMax(pNtk);
    iVar4 = Acb_NtkObjNumMax(pNtk);
    p_00 = Vec_BitStart(iVar4);
    Acb_NtkUpdateLevelD(pNtk,-1);
    for (RetValue = 2; -1 < RetValue; RetValue = RetValue + -1) {
      for (nNodes = 1; iVar4 = Vec_StrSize(&pNtk->vObjType), nNodes < iVar4; nNodes = nNodes + 1) {
        AVar5 = Acb_ObjType(pNtk,nNodes);
        if ((((AVar5 != ABC_OPER_NONE) && (iVar4 = Acb_ObjIsCio(pNtk,nNodes), iVar4 == 0)) &&
            (nNodes < iVar3)) &&
           ((iVar4 = Vec_BitEntry(p_00,nNodes), iVar4 == 0 &&
            (iVar4 = Acb_NtkObjMffcEstimate(pNtk,nNodes), RetValue <= iVar4)))) {
          p->nNodes = p->nNodes + 1;
          do {
            iVar4 = Acb_NtkOptNode(p,nNodes);
            bVar10 = false;
            if (iVar4 != 0) {
              iVar4 = Acb_ObjFaninNum(pNtk,nNodes);
              bVar10 = iVar4 != 0;
            }
          } while (bVar10);
          Vec_BitWriteEntry(p_00,nNodes,1);
        }
      }
    }
    Vec_BitFree(p_00);
  }
  if (pPars->fVerbose != 0) {
    aVar8 = Abc_Clock();
    p->timeTotal = aVar8 - p->timeTotal;
    uVar1 = p->nNodes;
    uVar2 = p->nWins;
    iVar3 = p->nWinsAll;
    iVar6 = Abc_MaxInt(1,p->nWins);
    iVar4 = p->nDivsAll;
    iVar7 = Abc_MaxInt(1,p->nWins);
    printf("Node = %d  Win = %d (Ave = %d)  DivAve = %d   Change = %d  C = %d  N1 = %d  N2 = %d  N3 = %d   Over = %d  Str = %d  2Node = %d.\n"
           ,(ulong)uVar1,(ulong)uVar2,(ulong)(uint)(iVar3 / iVar6),
           (long)iVar4 / (long)iVar7 & 0xffffffff,
           (ulong)(uint)(p->nChanges[0] + p->nChanges[1] + p->nChanges[2] + p->nChanges[3]),
           p->nChanges[0],p->nChanges[1],p->nChanges[2],p->nChanges[3],p->nOvers,StrCount,
           p->nTwoNodes);
    Abc_Print(1,"%s =","Windowing  ");
    if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
      local_90 = ((double)p->timeWin * 100.0) / (double)p->timeTotal;
    }
    else {
      local_90 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeWin * 1.0) / 1000000.0,local_90);
    Abc_Print(1,"%s =","CNF compute");
    if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
      local_a0 = ((double)p->timeCnf * 100.0) / (double)p->timeTotal;
    }
    else {
      local_a0 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeCnf * 1.0) / 1000000.0,local_a0);
    Abc_Print(1,"%s =","Make solver");
    if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
      local_b0 = ((double)p->timeSol * 100.0) / (double)p->timeTotal;
    }
    else {
      local_b0 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeSol * 1.0) / 1000000.0,local_b0);
    Abc_Print(1,"%s =","SAT solving");
    if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
      local_c0 = ((double)p->timeSat * 100.0) / (double)p->timeTotal;
    }
    else {
      local_c0 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeSat * 1.0) / 1000000.0,local_c0);
    Abc_Print(1,"%s =","TOTAL      ");
    if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
      local_d0 = ((double)p->timeTotal * 100.0) / (double)p->timeTotal;
    }
    else {
      local_d0 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeTotal * 1.0) / 1000000.0,local_d0);
    fflush(_stdout);
  }
  Acb_MfsStop(p);
  StrCount = 0;
  return;
}

Assistant:

void Acb_NtkOpt( Acb_Ntk_t * pNtk, Acb_Par_t * pPars )
{
    Acb_Mfs_t * pMan = Acb_MfsStart( pNtk, pPars );
    if ( pPars->fVerbose )
        printf( "%s-optimization parameters: TfiLev(I) = %d  TfoLev(O) = %d  WinMax(W) = %d  LutSize = %d\n", 
            pMan->pPars->fArea ? "Area" : "Delay", pMan->pPars->nTfiLevMax, pMan->pPars->nTfoLevMax, pMan->pPars->nWinNodeMax, pMan->pPars->nLutSize );
    Acb_NtkCreateFanout( pNtk );  // fanout data structure
    Acb_NtkCleanObjFuncs( pNtk ); // SAT variables
    Acb_NtkCleanObjCnfs( pNtk );  // CNF representations
    if ( pMan->pPars->fArea )
    {
        int n = 0, iObj, RetValue, nNodes = Acb_NtkObjNumMax(pNtk);
        Vec_Bit_t * vVisited = Vec_BitStart( Acb_NtkObjNumMax(pNtk) );
        Acb_NtkUpdateLevelD( pNtk, -1 ); // compute forward logic level
        for ( n = 2; n >= 0; n-- )
            Acb_NtkForEachNode( pNtk, iObj )
                if ( iObj < nNodes && !Vec_BitEntry(vVisited, iObj) && Acb_NtkObjMffcEstimate(pNtk, iObj) >= n )
                {
                    pMan->nNodes++;
                    //if ( iObj != 103 )
                    //    continue;
                    //Acb_NtkOptNode( pMan, iObj );
                    while ( (RetValue = Acb_NtkOptNode(pMan, iObj)) && Acb_ObjFaninNum(pNtk, iObj) );                    
                    Vec_BitWriteEntry( vVisited, iObj, 1 );
                }
        Vec_BitFree( vVisited );
    }
    else
    {
        int Value;
        Acb_NtkUpdateTiming( pNtk, -1 ); // compute delay information
        while ( (Value = (int)Vec_QueTopPriority(pNtk->vQue)) > 0 )
        {
            int iObj = Vec_QuePop(pNtk->vQue);
            if ( !Acb_ObjType(pNtk, iObj) )
                continue;
            //if ( iObj != 103 )
            //    continue;
            //printf( "Trying node %4d (%4d) ", iObj, Value );
            Acb_NtkOptNode( pMan, iObj ); 
        }
    }
    if ( pPars->fVerbose )
    {
        pMan->timeTotal = Abc_Clock() - pMan->timeTotal;
        printf( "Node = %d  Win = %d (Ave = %d)  DivAve = %d   Change = %d  C = %d  N1 = %d  N2 = %d  N3 = %d   Over = %d  Str = %d  2Node = %d.\n", 
            pMan->nNodes, pMan->nWins, pMan->nWinsAll/Abc_MaxInt(1, pMan->nWins), pMan->nDivsAll/Abc_MaxInt(1, pMan->nWins),
            pMan->nChanges[0] + pMan->nChanges[1] + pMan->nChanges[2] + pMan->nChanges[3],
            pMan->nChanges[0], pMan->nChanges[1], pMan->nChanges[2], pMan->nChanges[3], pMan->nOvers, StrCount, pMan->nTwoNodes );
        ABC_PRTP( "Windowing  ", pMan->timeWin,    pMan->timeTotal );
        ABC_PRTP( "CNF compute", pMan->timeCnf,    pMan->timeTotal );
        ABC_PRTP( "Make solver", pMan->timeSol,    pMan->timeTotal );
        ABC_PRTP( "SAT solving", pMan->timeSat,    pMan->timeTotal );
//        ABC_PRTP( "  unsat    ", pMan->timeSatU,   pMan->timeTotal );
//        ABC_PRTP( "  sat      ", pMan->timeSatS,   pMan->timeTotal );
        ABC_PRTP( "TOTAL      ", pMan->timeTotal,  pMan->timeTotal );
        fflush( stdout );
    }
    Acb_MfsStop( pMan );
    StrCount = 0;
}